

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

LexerState * raviX_init_lexer(CompilerState *compiler_state,char *buf,size_t buflen,char *source)

{
  CompilerState *compiler_state_00;
  char *input;
  int iVar1;
  LexerState *z;
  StringObject *pSVar2;
  size_t sVar3;
  int local_34;
  int i;
  LexerState *ls;
  char *source_local;
  size_t buflen_local;
  char *buf_local;
  CompilerState *compiler_state_local;
  
  z = (LexerState *)raviX_calloc(1,0x70);
  z->compiler_state = compiler_state;
  (z->t).token = 0;
  z->buf = buf;
  z->bufsize = buflen;
  z->n = z->bufsize;
  z->p = z->buf;
  iVar1 = zgetc(z);
  z->current = iVar1;
  (z->lookahead).token = 300;
  z->linenumber = 1;
  z->lastline = 1;
  z->source = source;
  pSVar2 = raviX_create_string(z->compiler_state,"_ENV",4);
  z->envn = pSVar2->str;
  z->buff = &compiler_state->buff;
  for (local_34 = 0; local_34 < 0x1a; local_34 = local_34 + 1) {
    compiler_state_00 = z->compiler_state;
    input = luaX_tokens[local_34];
    sVar3 = strlen(luaX_tokens[local_34]);
    raviX_create_string(compiler_state_00,input,(uint32_t)sVar3);
  }
  return z;
}

Assistant:

LexerState *raviX_init_lexer(CompilerState *compiler_state, const char *buf, size_t buflen,
				     const char *source)
{
	LexerState *ls = (LexerState *)raviX_calloc(1, sizeof(LexerState));
	ls->compiler_state = compiler_state;
	ls->t.token = 0;
	ls->buf = buf;
	ls->bufsize = buflen;
	ls->n = ls->bufsize;
	ls->p = ls->buf;
	ls->current = zgetc(ls);
	ls->lookahead.token = TOK_EOS; /* no look-ahead token */
	ls->linenumber = 1;
	ls->lastline = 1;
	ls->source = source;
	ls->envn = raviX_create_string(ls->compiler_state, LUA_ENV, (uint32_t)strlen(LUA_ENV))->str; /* get env name */
	ls->buff = &compiler_state->buff;
	for (int i = 0; i < NUM_RESERVED; i++) {
		raviX_create_string(ls->compiler_state, luaX_tokens[i], (uint32_t)strlen(luaX_tokens[i]));
	}
	return ls;
}